

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

bool __thiscall gl4cts::TextureBarrierBaseTest::featureSupported(TextureBarrierBaseTest *this)

{
  bool bVar1;
  API AVar2;
  
  AVar2 = this->m_api;
  if (AVar2 == API_GL_ARB_texture_barrier) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_texture_barrier");
    if (bVar1) {
      return true;
    }
    AVar2 = this->m_api;
  }
  return AVar2 == API_GL_45core;
}

Assistant:

bool featureSupported()
	{
		return (m_api == TextureBarrierTests::API_GL_ARB_texture_barrier &&
				m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_barrier")) ||
			   m_api == TextureBarrierTests::API_GL_45core;
	}